

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O2

int __thiscall helics::ActionMessage::serializedByteCount(ActionMessage *this)

{
  ulong uVar1;
  int iVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *str;
  pointer pbVar3;
  int iVar4;
  
  if (this->messageAction == cmd_time_request) {
    return 0x45;
  }
  uVar1 = (this->payload).bufferSize;
  iVar4 = (int)uVar1 + 0x2d;
  for (pbVar3 = (this->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar3 != (this->stringData).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar3 = pbVar3 + 1) {
    iVar4 = iVar4 + (int)pbVar3->_M_string_length + 4;
  }
  iVar2 = iVar4 + 4;
  if (uVar1 < 0xffffff) {
    iVar2 = iVar4;
  }
  return iVar2;
}

Assistant:

int ActionMessage::serializedByteCount() const
{
    int size{action_message_base_size};

    // for time request add an additional 3*8 bytes
    if (messageAction == CMD_TIME_REQUEST) {
        size += static_cast<int>(3 * sizeof(Time::baseType));
        return size;
    }
    size += static_cast<int>(payload.size());
    for (const auto& str : stringData) {
        // 4(to store the length)+length of the string
        size += static_cast<int>(sizeof(uint32_t) + str.size());
    }
    if (payload.size() >= maxPayloadSize) {
        size += 4;
    }
    return size;
}